

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScParser.cpp
# Opt level: O1

bool __thiscall ScParser::parseFunctionDecl(ScParser *this,char **data)

{
  char *pcVar1;
  bool bVar2;
  int iVar3;
  
  this->m_hasCurrentState = false;
  pcVar1 = *data;
  iVar3 = strncmp(pcVar1,"boost::statechart::",0x13);
  if (iVar3 != 0) {
    bVar2 = parseReactMethod(this,data);
    return bVar2;
  }
  *data = pcVar1 + 0x13;
  iVar3 = strncmp(pcVar1 + 0x13,"detail::reaction_result boost::statechart::",0x2b);
  if (iVar3 == 0) {
    *data = pcVar1 + 0x3e;
  }
  pcVar1 = *data;
  iVar3 = strncmp(pcVar1,"state_machine<",0xe);
  if (iVar3 == 0) {
    *data = pcVar1 + 0xe;
    parseStateMachine(this,data);
  }
  else {
    pcVar1 = *data;
    iVar3 = strncmp(pcVar1,"simple_state<",0xd);
    if (iVar3 != 0) {
      return false;
    }
    *data = pcVar1 + 0xd;
    parseSimpleState(this,data);
  }
  return true;
}

Assistant:

bool ScParser::parseFunctionDecl(char *&data)
{
    m_hasCurrentState = false;

    // boost::statechart::detail::reaction_result
    //     boost::statechart::simple_state< *state-spec* >::
    //         local_react<boost::mpl::list<
    //                         boost::statechart::custom_reaction< *event-name* >,
    //                         boost::statechart::deferral< * event-name * >,
    //                         mpl_::na, ..., mpl_::na> >(
    //                            boost::statechart::event_base const&, void const*)>

    if (expectStartsWith(data, "boost::statechart::")) {
        expectStartsWith(data, "detail::reaction_result boost::statechart::");
        // boost::statechart::state_machine<fsm::StateMachine, fsm::NotStarted, ...
        if (expectStartsWith(data, "state_machine<")) {
            parseStateMachine(data);
            return true;
        }
        // boost::statechart::simple_state<fsm::NotStarted, fsm::StateMachine, ...
        if (expectStartsWith(data, "simple_state<")) {
            parseSimpleState(data);
            return true;
        }
        return false;
    }
    return parseReactMethod(data);
}